

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRandomUniformBlockCase.cpp
# Opt level: O2

void __thiscall
vkt::ubo::RandomUniformBlockCase::generateBlock
          (RandomUniformBlockCase *this,Random *rnd,deUint32 layoutFlags)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  UniformBlock *block;
  deUint32 dVar4;
  bool bVar5;
  float fVar6;
  allocator<char> local_79;
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Block",&local_79);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &layoutFlagCandidates,&local_50,(char)this->m_blockNdx + 'A');
  block = ShaderInterface::allocBlock
                    (&(this->super_UniformBlockCase).m_interface,(string *)&layoutFlagCandidates);
  std::__cxx11::string::~string((string *)&layoutFlagCandidates);
  std::__cxx11::string::~string((string *)&local_50);
  iVar1 = 0;
  if (0 < this->m_maxInstances) {
    fVar6 = deRandom_getFloat(&rnd->m_rnd);
    iVar1 = 0;
    if (fVar6 < 0.3) {
      iVar1 = de::Random::getInt(rnd,0,this->m_maxInstances);
    }
  }
  iVar2 = de::Random::getInt(rnd,1,this->m_maxBlockMembers);
  if (iVar1 < 1) {
    bVar5 = de::Random::getBool(rnd);
    if (!bVar5) goto LAB_0066b45b;
  }
  else {
    block->m_arraySize = iVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"block",&local_79);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &layoutFlagCandidates,&local_50,(char)this->m_blockNdx + 'A');
  std::__cxx11::string::_M_assign((string *)&block->m_instanceName);
  std::__cxx11::string::~string((string *)&layoutFlagCandidates);
  std::__cxx11::string::~string((string *)&local_50);
LAB_0066b45b:
  layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&layoutFlagCandidates,(uint *)&local_50);
  if ((this->m_features & 0x4000) != 0) {
    local_50._M_dataplus._M_p._0_4_ = 0x20;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&layoutFlagCandidates,(uint *)&local_50);
  }
  uVar3 = de::Random::
          choose<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (rnd,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )layoutFlagCandidates.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )layoutFlagCandidates.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  dVar4 = uVar3 | layoutFlags;
  if ((this->m_features & 0x8000) != 0) {
    uVar3 = de::Random::choose<unsigned_int,unsigned_int_const*>
                      (rnd,generateBlock::matrixCandidates,generateType::precisionCandidates);
    dVar4 = dVar4 | uVar3;
  }
  block->m_flags = dVar4;
  iVar1 = 0;
  if (0 < iVar2) {
    iVar1 = iVar2;
  }
  while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
    generateUniform(this,rnd,block);
  }
  this->m_blockNdx = this->m_blockNdx + 1;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void RandomUniformBlockCase::generateBlock (de::Random& rnd, deUint32 layoutFlags)
{
	DE_ASSERT(m_blockNdx <= 'z' - 'a');

	const float		instanceArrayWeight	= 0.3f;
	UniformBlock&	block				= m_interface.allocBlock(std::string("Block") + (char)('A' + m_blockNdx));
	int				numInstances		= (m_maxInstances > 0 && rnd.getFloat() < instanceArrayWeight) ? rnd.getInt(0, m_maxInstances) : 0;
	int				numUniforms			= rnd.getInt(1, m_maxBlockMembers);

	if (numInstances > 0)
		block.setArraySize(numInstances);

	if (numInstances > 0 || rnd.getBool())
		block.setInstanceName(std::string("block") + (char)('A' + m_blockNdx));

	// Layout flag candidates.
	std::vector<deUint32> layoutFlagCandidates;
	layoutFlagCandidates.push_back(0);

	if (m_features & FEATURE_STD140_LAYOUT)
		layoutFlagCandidates.push_back(LAYOUT_STD140);

	layoutFlags |= rnd.choose<deUint32>(layoutFlagCandidates.begin(), layoutFlagCandidates.end());

	if (m_features & FEATURE_MATRIX_LAYOUT)
	{
		static const deUint32 matrixCandidates[] = { 0, LAYOUT_ROW_MAJOR, LAYOUT_COLUMN_MAJOR };
		layoutFlags |= rnd.choose<deUint32>(&matrixCandidates[0], &matrixCandidates[DE_LENGTH_OF_ARRAY(matrixCandidates)]);
	}

	block.setFlags(layoutFlags);

	for (int ndx = 0; ndx < numUniforms; ndx++)
		generateUniform(rnd, block);

	m_blockNdx += 1;
}